

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O0

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::ScreenLogicalDotsPerInchEvent,QScreen*,double,double>
               (QScreen *args,double args_1,double args_2)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ScreenLogicalDotsPerInchEvent *in_RDI;
  long in_FS_OFFSET;
  QScreen *in_XMM0_Qa;
  ScreenLogicalDotsPerInchEvent *in_XMM1_Qa;
  ScreenLogicalDotsPerInchEvent event;
  undefined4 in_stack_ffffffffffffff98;
  ProcessEventsFlag in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined1 local_40 [16];
  byte local_30;
  long lVar4;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = QThread::isMainThread();
  if ((uVar3 & 1) == 0) {
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::ScreenLogicalDotsPerInchEvent,QScreen*,double,double>
              ((QScreen *)in_RDI,(double)in_XMM0_Qa,(double)in_XMM1_Qa);
    QFlags<QEventLoop::ProcessEventsFlag>::QFlags
              ((QFlags<QEventLoop::ProcessEventsFlag> *)in_XMM1_Qa,in_stack_ffffffffffffff9c);
    bVar1 = QWindowSystemInterface::flushWindowSystemEvents
                      ((QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>)
                       SUB84((ulong)lVar4 >> 0x20,0));
    goto LAB_0044ec36;
  }
  memcpy(local_40,&DAT_00ba3da0,0x38);
  QWindowSystemInterfacePrivate::ScreenLogicalDotsPerInchEvent::ScreenLogicalDotsPerInchEvent
            (in_RDI,in_XMM0_Qa,(qreal)in_XMM1_Qa,
             (qreal)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent
              ((WindowSystemEvent *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
LAB_0044ebe7:
    bVar1 = local_30 & 1;
  }
  else {
    uVar2 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,local_40);
    if ((uVar2 & 1) != 0) goto LAB_0044ebe7;
    bVar1 = 0;
  }
  QWindowSystemInterfacePrivate::ScreenLogicalDotsPerInchEvent::~ScreenLogicalDotsPerInchEvent
            (in_XMM1_Qa);
LAB_0044ec36:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}